

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * QDir::currentPath(void)

{
  long lVar1;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QFileSystemEngine::currentPath();
  QFileSystemEntry::filePath(this);
  QFileSystemEntry::~QFileSystemEntry(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &in_RDI->m_filePath;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::currentPath()
{
    return QFileSystemEngine::currentPath().filePath();
}